

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O3

void __thiscall
agge::tests::PathGeneratorAdapterTests::PathIteratorRewoundOnStart(PathGeneratorAdapterTests *this)

{
  pointer ppVar1;
  uint uVar2;
  pointer ppVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  mock_path_sink s;
  path p;
  point input [3];
  vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_> local_e8
  ;
  ulong local_d0;
  mock_path_sink local_c8;
  string local_b0;
  vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_> local_90
  ;
  ulong local_78;
  LocationInfo local_70;
  undefined1 local_48 [8];
  undefined1 auStack_40 [16];
  point pStack_30;
  point local_24;
  
  auStack_40._8_4_ = 23.0;
  auStack_40._12_4_ = 2;
  pStack_30.x = 3.0;
  pStack_30.y = 7.0;
  local_48._0_4_ = 10.0;
  local_48._4_4_ = 13.0;
  auStack_40._0_4_ = 1;
  auStack_40._4_4_ = 11.0;
  pStack_30.command = 2;
  std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>::
  vector<agge::tests::mocks::path::point*>
            ((vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>
              *)&local_90,(point *)local_48,&local_24,(allocator_type *)&local_70);
  local_78 = 0;
  local_c8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = (long)local_90.
                super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_90.
                super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)(lVar5 != 0);
  uVar6 = (lVar5 >> 2) * -0x5555555555555555;
  if ((lVar5 != 0 || uVar4 <= uVar6 && uVar6 - uVar4 != 0) &&
     (local_78 = (ulong)(local_90.
                         super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                        local_90.
                        super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                        ._M_impl.super__Vector_impl_data._M_start) + 1,
     uVar6 < uVar4 || uVar6 - uVar4 == 0)) {
    local_78 = uVar4;
  }
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  vector(&local_e8,&local_90);
  local_d0 = 0;
  if (local_e8.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e8.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_d0 = 0;
    do {
      ppVar1 = local_e8.
               super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
               ._M_impl.super__Vector_impl_data._M_start + local_d0;
      ppVar3 = local_e8.
               super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
               ._M_impl.super__Vector_impl_data._M_start + local_d0;
      uVar4 = local_d0 + 1;
      uVar2 = local_e8.
              super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              ._M_impl.super__Vector_impl_data._M_start[local_d0].command;
      local_d0 = uVar4;
      if (uVar2 == 0) goto LAB_001574ee;
      if ((uVar2 & 7) == 2) {
        mock_path_sink::line_to(&local_c8,ppVar1->x,ppVar3->y);
      }
      else if ((uVar2 & 7) == 1) {
        mock_path_sink::move_to(&local_c8,ppVar1->x,ppVar3->y);
      }
      if ((uVar2 & 0x20) != 0) {
        mock_path_sink::close_polygon(&local_c8);
      }
    } while (local_d0 <
             (ulong)(((long)local_e8.
                            super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_e8.
                            super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555));
  }
  if (local_e8.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_001574ee:
    operator_delete(local_e8.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_70,&local_b0,0x174);
  ut::
  are_equal<agge::tests::mocks::path::point,3ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [3])local_48,&local_c8.points,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filename._M_dataplus._M_p != &local_70.filename.field_2) {
    operator_delete(local_70.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_c8.points.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.points.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

test( PathIteratorRewoundOnStart )
			{
				// INIT
				mocks::path::point input[] = {
					{ 10.0f, 13.0f, path_command_move_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 3.0f, 7.0f, path_command_line_to },
				};
				mocks::path p(input);
				mock_path_sink s;
				real_t dummy;

				p.vertex(&dummy, &dummy);
				p.vertex(&dummy, &dummy);

				// ACT
				add_path(s, p);

				// ASSERT
				assert_equal(input, s.points);
			}